

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int WriteImageSize(WebPPicture *pic,VP8LBitWriter *bw)

{
  uint32_t bits;
  int n_bits;
  VP8LBitWriter *in_RSI;
  long in_RDI;
  int height;
  int width;
  
  bits = *(int *)(in_RDI + 8) - 1;
  n_bits = *(int *)(in_RDI + 0xc) + -1;
  VP8LPutBits(in_RSI,bits,n_bits);
  VP8LPutBits(in_RSI,bits,n_bits);
  return (int)((in_RSI->error_ != 0 ^ 0xffU) & 1);
}

Assistant:

static int WriteImageSize(const WebPPicture* const pic,
                          VP8LBitWriter* const bw) {
  const int width = pic->width - 1;
  const int height = pic->height - 1;
  assert(width < WEBP_MAX_DIMENSION && height < WEBP_MAX_DIMENSION);

  VP8LPutBits(bw, width, VP8L_IMAGE_SIZE_BITS);
  VP8LPutBits(bw, height, VP8L_IMAGE_SIZE_BITS);
  return !bw->error_;
}